

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

void __thiscall
ymfm::opll_registers::cache_operator_data
          (opll_registers *this,uint32_t choffs,uint32_t opoffs,opdata_cache *cache)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint ksr;
  uint8_t local_75;
  uint8_t local_74;
  uint8_t *local_50;
  uint32_t ksrval;
  uint8_t RS;
  uint8_t RR;
  uint8_t DP;
  uint32_t ksl;
  uint32_t multiple;
  uint32_t keycode;
  uint32_t block_freq;
  uint32_t instrument;
  opdata_cache *cache_local;
  uint32_t opoffs_local;
  uint32_t choffs_local;
  opll_registers *this_local;
  
  uVar2 = ch_instrument(this,choffs);
  uVar3 = rhythm_enable(this);
  if ((uVar3 == 0) || (choffs < 6)) {
    if (uVar2 == 0) {
      local_50 = this->m_regdata;
    }
    else {
      local_50 = this->m_instdata + (uVar2 - 1) * 8;
    }
    this->m_chinst[choffs] = local_50;
  }
  else {
    this->m_chinst[choffs] = this->m_instdata + (choffs + 9) * 8;
  }
  puVar1 = this->m_chinst[choffs];
  uVar2 = bitfield(opoffs,0,1);
  this->m_opinst[opoffs] = puVar1 + uVar2;
  uVar2 = op_waveform(this,opoffs);
  cache->waveform = this->m_waveform[uVar2 & 1];
  uVar2 = ch_block_freq(this,choffs);
  cache->block_freq = uVar2;
  uVar3 = bitfield(uVar2,8,4);
  cache->detune = 0;
  uVar4 = op_multiple(this,opoffs);
  uVar5 = bitfield(0xc2aa,uVar4,1);
  cache->multiple = (uVar4 & 0xe | uVar5) << 1;
  if (cache->multiple == 0) {
    cache->multiple = 1;
  }
  uVar4 = op_lfo_pm_enable(this,opoffs);
  if (uVar4 == 0) {
    uVar4 = compute_phase_step(this,choffs,opoffs,cache,0);
    cache->phase_step = uVar4;
  }
  else {
    cache->phase_step = 1;
  }
  uVar4 = bitfield(opoffs,0,1);
  if (uVar4 != 1) {
    uVar4 = rhythm_enable(this);
    if ((uVar4 == 0) || (choffs < 7)) {
      uVar4 = ch_total_level(this,choffs);
      cache->total_level = uVar4;
      goto LAB_001acb7f;
    }
  }
  uVar4 = op_volume(this,opoffs);
  cache->total_level = uVar4 << 2;
LAB_001acb7f:
  cache->total_level = cache->total_level << 3;
  uVar4 = op_ksl(this,opoffs);
  if (uVar4 != 0) {
    uVar5 = bitfield(uVar2,9,3);
    uVar2 = bitfield(uVar2,5,4);
    uVar2 = opl_key_scale_atten(uVar5,uVar2);
    cache->total_level = (uVar2 << ((byte)uVar4 & 0x1f)) + cache->total_level;
  }
  uVar2 = op_sustain_level(this,opoffs);
  cache->eg_sustain = uVar2;
  cache->eg_sustain = cache->eg_sustain + 1 & 0x10 | cache->eg_sustain;
  cache->eg_sustain = cache->eg_sustain << 5;
  uVar2 = op_ksr(this,opoffs);
  ksr = uVar3 >> ((byte)((uVar2 ^ 1) << 1) & 0x1f);
  cache->eg_rate[0] = '0';
  uVar2 = op_attack_rate(this,opoffs);
  uVar2 = fm_registers_base::effective_rate(uVar2 << 2,ksr);
  cache->eg_rate[1] = (uint8_t)uVar2;
  uVar2 = op_decay_rate(this,opoffs);
  uVar2 = fm_registers_base::effective_rate(uVar2 << 2,ksr);
  cache->eg_rate[2] = (uint8_t)uVar2;
  uVar2 = op_eg_sustain(this,opoffs);
  if (uVar2 == 0) {
    uVar2 = op_release_rate(this,opoffs);
    uVar2 = fm_registers_base::effective_rate(uVar2 << 2,ksr);
    cache->eg_rate[3] = (uint8_t)uVar2;
    uVar2 = ch_sustain(this,choffs);
    local_75 = '\x14';
    if (uVar2 == 0) {
      local_75 = '\x1c';
    }
    cache->eg_rate[4] = local_75;
  }
  else {
    cache->eg_rate[3] = '\0';
    uVar2 = ch_sustain(this,choffs);
    if (uVar2 == 0) {
      uVar2 = op_release_rate(this,opoffs);
      uVar2 = fm_registers_base::effective_rate(uVar2 << 2,ksr);
      local_74 = (uint8_t)uVar2;
    }
    else {
      local_74 = '\x14';
    }
    cache->eg_rate[4] = local_74;
  }
  return;
}

Assistant:

void opll_registers::cache_operator_data(uint32_t choffs, uint32_t opoffs, opdata_cache &cache)
{
	// first set up the instrument data
	uint32_t instrument = ch_instrument(choffs);
	if (rhythm_enable() && choffs >= 6)
		m_chinst[choffs] = &m_instdata[8 * (15 + (choffs - 6))];
	else
		m_chinst[choffs] = (instrument == 0) ? &m_regdata[0] : &m_instdata[8 * (instrument - 1)];
	m_opinst[opoffs] = m_chinst[choffs] + bitfield(opoffs, 0);

	// set up the easy stuff
	cache.waveform = &m_waveform[op_waveform(opoffs) % WAVEFORMS][0];

	// get frequency from the channel
	uint32_t block_freq = cache.block_freq = ch_block_freq(choffs);

	// compute the keycode: block_freq is:
	//
	//     11  |
	//     1098|76543210
	//     BBBF|FFFFFFFF
	//     ^^^^
	//
	// the 4-bit keycode uses the top 4 bits
	uint32_t keycode = bitfield(block_freq, 8, 4);

	// no detune adjustment on OPLL
	cache.detune = 0;

	// multiple value, as an x.1 value (0 means 0.5)
	// replace the low bit with a table lookup to give 0,1,2,3,4,5,6,7,8,9,10,10,12,12,15,15
	uint32_t multiple = op_multiple(opoffs);
	cache.multiple = ((multiple & 0xe) | bitfield(0xc2aa, multiple)) * 2;
	if (cache.multiple == 0)
		cache.multiple = 1;

	// phase step, or PHASE_STEP_DYNAMIC if PM is active; this depends on
	// block_freq, detune, and multiple, so compute it after we've done those
	if (op_lfo_pm_enable(opoffs) == 0)
		cache.phase_step = compute_phase_step(choffs, opoffs, cache, 0);
	else
		cache.phase_step = opdata_cache::PHASE_STEP_DYNAMIC;

	// total level, scaled by 8; for non-rhythm operator 0, this is the total
	// level from the instrument data; for other operators it is 4*volume
	if (bitfield(opoffs, 0) == 1 || (rhythm_enable() && choffs >= 7))
		cache.total_level = op_volume(opoffs) * 4;
	else
		cache.total_level = ch_total_level(choffs);
	cache.total_level <<= 3;

	// pre-add key scale level
	uint32_t ksl = op_ksl(opoffs);
	if (ksl != 0)
		cache.total_level += opl_key_scale_atten(bitfield(block_freq, 9, 3), bitfield(block_freq, 5, 4)) << ksl;

	// 4-bit sustain level, but 15 means 31 so effectively 5 bits
	cache.eg_sustain = op_sustain_level(opoffs);
	cache.eg_sustain |= (cache.eg_sustain + 1) & 0x10;
	cache.eg_sustain <<= 5;

	// The envelope diagram in the YM2413 datasheet gives values for these
	// in ms from 0->48dB. The attack/decay tables give values in ms from
	// 0->96dB, so to pick an equivalent decay rate, we want to find the
	// closest match that is 2x the 0->48dB value:
	//
	//     DP =   10ms (0->48db) ->   20ms (0->96db); decay of 12 gives   19.20ms
	//     RR =  310ms (0->48db) ->  620ms (0->96db); decay of  7 gives  613.76ms
	//     RS = 1200ms (0->48db) -> 2400ms (0->96db); decay of  5 gives 2455.04ms
	//
	// The envelope diagram for percussive sounds (eg_sustain() == 0) also uses
	// "RR" to mean both the constant RR above and the Release Rate specified in
	// the instrument data. In this case, Relief Pitcher's credit sound bears out
	// that the Release Rate is used during sustain, and that the constant RR
	// (or RS) is used during the release phase.
	constexpr uint8_t DP = 12 * 4;
	constexpr uint8_t RR = 7 * 4;
	constexpr uint8_t RS = 5 * 4;

	// determine KSR adjustment for envelope rates
	uint32_t ksrval = keycode >> (2 * (op_ksr(opoffs) ^ 1));
	cache.eg_rate[EG_DEPRESS] = DP;
	cache.eg_rate[EG_ATTACK] = effective_rate(op_attack_rate(opoffs) * 4, ksrval);
	cache.eg_rate[EG_DECAY] = effective_rate(op_decay_rate(opoffs) * 4, ksrval);
	if (op_eg_sustain(opoffs))
	{
		cache.eg_rate[EG_SUSTAIN] = 0;
		cache.eg_rate[EG_RELEASE] = ch_sustain(choffs) ? RS : effective_rate(op_release_rate(opoffs) * 4, ksrval);
	}
	else
	{
		cache.eg_rate[EG_SUSTAIN] = effective_rate(op_release_rate(opoffs) * 4, ksrval);
		cache.eg_rate[EG_RELEASE] = ch_sustain(choffs) ? RS : RR;
	}
}